

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O1

void av1_k_means_dim1(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  byte bVar1;
  int16_t *__s1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int64_t this_dist;
  uint8_t *meta_indices [2];
  int16_t *meta_centroids [2];
  int16_t centroids_tmp [8];
  int count [8];
  int centroids_sum [8];
  uint8_t indices_tmp [4096];
  int local_1110;
  long local_1100;
  long local_10f8;
  int16_t *local_10f0;
  uint8_t *local_10e8;
  ulong local_10e0;
  uint8_t *local_10d8 [5];
  size_t local_10b0;
  size_t local_10a8;
  long local_10a0;
  ulong local_1098;
  ulong local_1090;
  undefined1 local_1088 [16];
  int local_1078 [16];
  undefined1 local_1038 [4104];
  
  local_10d8[3] = local_1088;
  local_10d8[1] = local_1038;
  local_10d8[0] = indices;
  local_10d8[2] = (uint8_t *)centroids;
  (*av1_calc_indices_dim1)(data,centroids,indices,&local_1100,n,k);
  lVar7 = (long)k;
  if (max_itr < 1) {
    uVar9 = 0;
    local_1110 = 0;
    iVar4 = 0;
  }
  else {
    local_10a8 = lVar7 * 4;
    local_10b0 = lVar7 * 2;
    uVar5 = 0;
    local_1110 = 0;
    uVar9 = 0;
    local_10f8 = lVar7;
    local_10f0 = centroids;
    local_10e8 = indices;
    do {
      local_10a0 = local_1100;
      local_1090 = (ulong)((uint)uVar9 ^ 1);
      __s1 = (int16_t *)local_10d8[local_1090 + 2];
      local_1098 = uVar9 & 0xffffffff;
      puVar2 = local_10d8[uVar9 & 0xffffffff];
      local_1078[4] = 0;
      local_1078[5] = 0;
      local_1078[6] = 0;
      local_1078[7] = 0;
      local_1078[0] = 0;
      local_1078[1] = 0;
      local_1078[2] = 0;
      local_1078[3] = 0;
      uVar10 = (uint)*data;
      local_10e0 = uVar5;
      memset(local_1078 + 8,0,local_10a8);
      uVar9 = local_1090;
      uVar5 = local_1098;
      if (0 < n) {
        uVar6 = 0;
        do {
          bVar1 = puVar2[uVar6];
          local_1078[bVar1] = local_1078[bVar1] + 1;
          local_1078[(ulong)bVar1 + 8] = local_1078[(ulong)bVar1 + 8] + (int)data[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uint)n != uVar6);
      }
      if (0 < k) {
        uVar6 = 0;
        do {
          iVar4 = local_1078[uVar6];
          if (iVar4 == 0) {
            uVar10 = uVar10 * 0x41c64e6d + 0x3039;
            __s1[uVar6] = data[(ulong)(uVar10 >> 0x10 & 0x7fff) % (ulong)(uint)n];
          }
          else {
            __s1[uVar6] = (int16_t)(((iVar4 >> 1) + local_1078[uVar6 + 8]) / iVar4);
          }
          uVar6 = uVar6 + 1;
        } while ((uint)k != uVar6);
      }
      iVar4 = bcmp(__s1,local_10d8[local_1098 + 2],local_10b0);
      if (iVar4 == 0) {
        bVar3 = false;
        iVar4 = local_1110;
      }
      else {
        (*av1_calc_indices_dim1)(data,__s1,local_10d8[uVar9],&local_1100,n,k);
        bVar3 = local_1100 <= local_10a0;
        iVar4 = (int)uVar5;
        if (local_1100 <= local_10a0) {
          iVar4 = local_1110;
        }
      }
      local_1110 = iVar4;
      lVar7 = local_10f8;
      indices = local_10e8;
      centroids = local_10f0;
      iVar4 = (int)local_10e0;
    } while ((bVar3) &&
            (uVar10 = (int)local_10e0 + 1, uVar5 = (ulong)uVar10, iVar4 = max_itr, uVar10 != max_itr
            ));
  }
  iVar8 = (int)uVar9;
  if (iVar4 != max_itr) {
    iVar8 = local_1110;
  }
  if (iVar8 != 0) {
    memcpy(centroids,local_1088,lVar7 * 2);
    memcpy(indices,local_1038,(long)n);
  }
  return;
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}